

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O3

void __thiscall Fl_Group::clear(Fl_Group *this)

{
  Fl_Widget **ppFVar1;
  Fl_Widget *pFVar2;
  int iVar3;
  ulong uVar4;
  Fl_Widget ***pppFVar5;
  uint uVar6;
  Fl_Widget **ppFVar7;
  ulong uVar8;
  Fl_Group *o;
  
  this->savedfocus_ = (Fl_Widget *)0x0;
  this->resizable_ = &this->super_Fl_Widget;
  if (this->sizes_ != (int *)0x0) {
    operator_delete__(this->sizes_);
  }
  this->sizes_ = (int *)0x0;
  o = (Fl_Group *)Fl::pushed_;
  iVar3 = Fl_Widget::contains(&this->super_Fl_Widget,Fl::pushed_);
  if (iVar3 != 0) {
    o = this;
  }
  Fl::pushed(&this->super_Fl_Widget);
  uVar6 = this->children_;
  uVar4 = (ulong)uVar6;
  if (1 < (int)uVar6) {
    ppFVar1 = this->array_;
    ppFVar7 = ppFVar1 + uVar4;
    uVar8 = 0;
    do {
      ppFVar7 = ppFVar7 + -1;
      pFVar2 = ppFVar1[uVar8];
      ppFVar1[uVar8] = *ppFVar7;
      *ppFVar7 = pFVar2;
      uVar8 = uVar8 + 1;
    } while (uVar6 >> 1 != uVar8);
  }
  if (uVar6 != 0) {
    do {
      iVar3 = (int)uVar4;
      pppFVar5 = &this->array_;
      if (1 < iVar3) {
        pppFVar5 = (Fl_Widget ***)this->array_;
      }
      uVar6 = iVar3 - 1;
      ppFVar7 = pppFVar5[(long)iVar3 + -1];
      if ((Fl_Group *)ppFVar7[1] == this) {
        if (iVar3 < 3) {
          remove(this,(char *)(ulong)uVar6);
        }
        else {
          ppFVar7[1] = (Fl_Widget *)0x0;
          this->children_ = uVar6;
        }
        (*(code *)(*ppFVar7)->parent_)(ppFVar7);
      }
      else {
        remove(this,(char *)(ulong)uVar6);
      }
      uVar4 = (ulong)(uint)this->children_;
    } while (this->children_ != 0);
  }
  if (o != this) {
    Fl::pushed(&o->super_Fl_Widget);
    return;
  }
  return;
}

Assistant:

void Fl_Group::clear() {
  savedfocus_ = 0;
  resizable_ = this;
  init_sizes();

  // we must change the Fl::pushed() widget, if it is one of
  // the group's children. Otherwise fl_fix_focus() would send
  // lots of events to children that are about to be deleted
  // anyway.

  Fl_Widget *pushed = Fl::pushed();	// save pushed() widget
  if (contains(pushed)) pushed = this;	// set it to be the group, if it's a child
  Fl::pushed(this);			// for fl_fix_focus etc.

  // okay, now it is safe to destroy the children:

#define REVERSE_CHILDREN
#ifdef  REVERSE_CHILDREN
  // Reverse the order of the children. Doing this and deleting
  // always the last child is much faster than the other way around.
  if (children_ > 1) {
    Fl_Widget *temp;
    Fl_Widget **a = (Fl_Widget**)array();
    for (int i=0,j=children_-1; i<children_/2; i++,j--) {
      temp = a[i];
      a[i] = a[j];
      a[j] = temp;
    }
  }
#endif // REVERSE_CHILDREN

  while (children_) {			// delete all children
    int idx = children_-1;		// last child's index
    Fl_Widget* w = child(idx);		// last child widget
    if (w->parent()==this) {		// should always be true
      if (children_>2) {		// optimized removal
        w->parent_ = 0;			// reset child's parent
        children_--;			// update counter
      } else {				// slow removal
        remove(idx);
      }
      delete w;				// delete the child
    } else {				// should never happen
      remove(idx);			// remove it anyway
    }
  }

  if (pushed != this) Fl::pushed(pushed); // reset pushed() widget

}